

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reshape.cpp
# Opt level: O1

void __thiscall ncnn::Reshape::Reshape(Reshape *this)

{
  Layer::Layer(&this->super_Layer);
  (this->super_Layer)._vptr_Layer = (_func_int **)&PTR__Reshape_00653318;
  (this->shape_expr)._M_dataplus._M_p = (pointer)&(this->shape_expr).field_2;
  (this->shape_expr)._M_string_length = 0;
  (this->shape_expr).field_2._M_local_buf[0] = '\0';
  (this->super_Layer).one_blob_only = true;
  (this->super_Layer).support_inplace = false;
  return;
}

Assistant:

Reshape::Reshape()
{
    one_blob_only = true;
    support_inplace = false;
}